

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

value * __thiscall
mjs::anon_unknown_35::unescape
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  int iVar1;
  value *pvVar2;
  runtime_error *this_00;
  size_t sVar3;
  gc_heap_ptr<mjs::global_object> *pgVar4;
  wchar_t wVar5;
  wstring res;
  gc_heap_ptr_untyped local_80;
  wchar_t *local_70;
  size_t local_68;
  wchar_t local_60;
  undefined4 uStack_5c;
  value *local_50;
  anon_unknown_35 *local_48;
  wstring_view local_40;
  
  sVar3 = s._M_len;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = L'\0';
  local_50 = __return_storage_ptr__;
  local_48 = this;
  if (global != (gc_heap_ptr<mjs::global_object> *)0x0) {
    pgVar4 = (gc_heap_ptr<mjs::global_object> *)0x0;
    do {
      wVar5 = (wchar_t)&local_70;
      if (*(int *)(sVar3 + (long)pgVar4 * 4) == 0x25) {
        if (global < (gc_heap_ptr<mjs::global_object> *)
                     ((long)&(pgVar4->super_gc_heap_ptr_untyped).heap_ + 3U)) {
LAB_0013c653:
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Invalid string in unescape");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar1 = *(int *)(sVar3 + 4 + (long)pgVar4 * 4);
        if (global < (gc_heap_ptr<mjs::global_object> *)
                     ((long)&(pgVar4->super_gc_heap_ptr_untyped).heap_ + 6U) && iVar1 == 0x75)
        goto LAB_0013c653;
        if (iVar1 == 0x75) {
          get_hex_value4((wchar_t *)(sVar3 + 8 + (long)pgVar4 * 4));
          std::__cxx11::wstring::push_back(wVar5);
          pgVar4 = (gc_heap_ptr<mjs::global_object> *)
                   ((long)&(pgVar4->super_gc_heap_ptr_untyped).heap_ + 5);
        }
        else {
          get_hex_value2((wchar_t *)((long)pgVar4 * 4 + sVar3 + 4));
          std::__cxx11::wstring::push_back(wVar5);
          pgVar4 = (gc_heap_ptr<mjs::global_object> *)
                   ((long)&(pgVar4->super_gc_heap_ptr_untyped).heap_ + 2);
        }
      }
      else {
        std::__cxx11::wstring::push_back(wVar5);
      }
      pgVar4 = (gc_heap_ptr<mjs::global_object> *)
               ((long)&(pgVar4->super_gc_heap_ptr_untyped).heap_ + 1);
    } while (pgVar4 < global);
  }
  local_40._M_len = local_68;
  local_40._M_str = local_70;
  string::string((string *)&local_80,*(gc_heap **)local_48,&local_40);
  pvVar2 = local_50;
  local_50->type_ = string;
  (local_50->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       local_80.heap_;
  *(uint32_t *)((long)&local_50->field_1 + 8) = local_80.pos_;
  if (local_80.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)&(local_50->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT44(uStack_5c,local_60) * 4 + 4);
  }
  return pvVar2;
}

Assistant:

value unescape(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (size_t i = 0; i < s.length(); ++i) {
        if (s[i] != '%') {
            res.push_back(s[i]);
            continue;
        }
        ++i;
        if (i + 2 > s.length() || (s[i] == 'u' && i + 5 > s.length())) {
            throw std::runtime_error("Invalid string in unescape");
        }
        if (s[i] == 'u') {
            res.push_back(static_cast<wchar_t>(get_hex_value4(&s[i+1])));
            i += 4;
        } else {
            res.push_back(static_cast<wchar_t>(get_hex_value2(&s[i])));
            i += 1;
        }
    }
    return value{string{global.heap(), res}};
}